

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_union_struct(flatcc_union_verifier_descriptor_t *ud,size_t size,uint16_t align)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = 0x12;
  if (ud->offset != 0) {
    uVar1 = ud->end;
    uVar3 = ud->offset + ud->base;
    if (uVar3 <= uVar1) {
      iVar2 = 10;
      uVar4 = (uint)size + uVar3;
      if (!CARRY4((uint)size,uVar3)) {
        if (uVar1 < uVar4) {
          return (uVar4 <= uVar1) + 9;
        }
        iVar2 = 0xb;
        if ((uVar3 & align - 1) == 0) {
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int flatcc_verify_union_struct(flatcc_union_verifier_descriptor_t *ud, size_t size, uint16_t align)
{
    return verify_struct(ud->end, ud->base, ud->offset, (uoffset_t)size, align);
}